

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void free_tags(void)

{
  union_tag *puVar1;
  union_tag *next;
  union_tag *p;
  
  next = tag_table;
  while (next != (union_tag *)0x0) {
    puVar1 = next->next;
    free(next->name);
    free(next);
    next = puVar1;
  }
  tag_table = (union_tag *)0x0;
  return;
}

Assistant:

void free_tags()
{
union_tag	*p, *next;

    for (p = tag_table; p; p = next) {
	next = p->next;
	FREE(p->name);
	FREE(p); }
    tag_table = 0;
}